

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O1

int jpc_com_dumpparms(jpc_ms_t *ms,FILE *out)

{
  ulong uVar1;
  ushort **ppuVar2;
  uint uVar3;
  ulong uVar4;
  
  fprintf((FILE *)out,"regid = %lu;\n",(ms->parms).sot.tileno);
  uVar1 = (ms->parms).sot.len;
  if (uVar1 != 0) {
    ppuVar2 = __ctype_b_loc();
    uVar3 = 1;
    uVar4 = 0;
    do {
      if ((*(byte *)((long)*ppuVar2 + (ulong)(ms->parms).ppm.data[uVar4] * 2 + 1) & 0x40) == 0) {
        return 0;
      }
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar4 < uVar1);
  }
  fwrite("data = ",7,1,(FILE *)out);
  fwrite((ms->parms).ppm.data,1,(ms->parms).sot.len,(FILE *)out);
  fputc(10,(FILE *)out);
  return 0;
}

Assistant:

static int jpc_com_dumpparms(jpc_ms_t *ms, FILE *out)
{
	jpc_com_t *com = &ms->parms.com;
	unsigned int i;
	int printable;
	fprintf(out, "regid = %"PRIuFAST16";\n", com->regid);
	printable = 1;
	for (i = 0; i < com->len; ++i) {
		if (!isprint(com->data[i])) {
			printable = 0;
			break;
		}
	}
	if (printable) {
		fprintf(out, "data = ");
		fwrite(com->data, sizeof(char), com->len, out);
		fprintf(out, "\n");
	}
	return 0;
}